

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O2

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  bool bVar1;
  __type_conflict1 _Var2;
  undefined1 *puVar3;
  allocator local_91;
  string desktop_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  regex match_no;
  string pfd_verbose;
  
  flags(pfd::settings::flag)::flags._0_1_ = !resync & (byte)flags(pfd::settings::flag)::flags;
  if ((byte)flags(pfd::settings::flag)::flags != 0) {
    return;
  }
  std::__cxx11::string::string((string *)&match_no,"PFD_VERBOSE",(allocator *)&desktop_name);
  internal::getenv((internal *)&pfd_verbose,(char *)&match_no);
  std::__cxx11::string::~string((string *)&match_no);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&match_no,"(|0|no|false)",1);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&pfd_verbose,&match_no,0);
  if (!bVar1) {
    flags(pfd::settings::flag)::flags._1_1_ = 1;
  }
  std::__cxx11::string::string((string *)&desktop_name,"zenity",(allocator *)&local_70);
  flags(pfd::settings::flag)::flags._2_1_ = check_program(this,&desktop_name);
  std::__cxx11::string::~string((string *)&desktop_name);
  std::__cxx11::string::string((string *)&desktop_name,"matedialog",(allocator *)&local_70);
  flags(pfd::settings::flag)::flags._3_1_ = check_program(this,&desktop_name);
  std::__cxx11::string::~string((string *)&desktop_name);
  std::__cxx11::string::string((string *)&desktop_name,"qarma",(allocator *)&local_70);
  flags(pfd::settings::flag)::flags._4_1_ = check_program(this,&desktop_name);
  std::__cxx11::string::~string((string *)&desktop_name);
  std::__cxx11::string::string((string *)&desktop_name,"kdialog",(allocator *)&local_70);
  flags(pfd::settings::flag)::flags._5_1_ = check_program(this,&desktop_name);
  std::__cxx11::string::~string((string *)&desktop_name);
  if ((flags(pfd::settings::flag)::flags._2_1_ != '\x01') ||
     (flags(pfd::settings::flag)::flags._5_1_ != '\x01')) goto LAB_0011ffc1;
  std::__cxx11::string::string((string *)&local_70,"XDG_SESSION_DESKTOP",&local_91);
  internal::getenv((internal *)&desktop_name,(char *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"gnome",&local_91);
  _Var2 = std::operator==(&desktop_name,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (_Var2) {
    puVar3 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 5);
LAB_0011ffb4:
    *puVar3 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"KDE",&local_91);
    _Var2 = std::operator==(&desktop_name,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) {
      puVar3 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 2);
      goto LAB_0011ffb4;
    }
  }
  std::__cxx11::string::~string((string *)&desktop_name);
LAB_0011ffc1:
  flags(pfd::settings::flag)::flags._0_1_ = 1;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&match_no);
  std::__cxx11::string::~string((string *)&pfd_verbose);
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

    auto pfd_verbose = internal::getenv("PFD_VERBOSE");
    auto match_no = std::regex("(|0|no|false)", std::regex_constants::icase);
    if (!std::regex_match(pfd_verbose, match_no))
        flags(flag::is_verbose) = true;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = internal::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}